

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

Vec_Int_t * Gia_ManDfsRequireds(Gia_Man_t *p,Vec_Int_t *vObjs,int ReqTime)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  float fVar11;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  p_01 = Vec_IntStartFull(p->nObjs);
  iVar9 = 0;
  Vec_IntWriteEntry(p_01,0,0);
  if (p_00 == (Tim_Man_t *)0x0) {
    iVar9 = 0;
    while ((iVar9 < p->vCos->nSize && (pGVar6 = Gia_ManCo(p,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
      iVar4 = Gia_ObjFaninId0p(p,pGVar6);
      Gia_ManDfsUpdateRequired(p_01,iVar4,ReqTime);
      iVar9 = iVar9 + 1;
    }
  }
  else {
    iVar4 = p->vCos->nSize;
    iVar1 = Tim_ManPoNum(p_00);
    Tim_ManIncrementTravId(p_00);
    while ((iVar9 < p->vCos->nSize && (pGVar6 = Gia_ManCo(p,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
      if (iVar4 - iVar1 <= iVar9) {
        Tim_ManSetCoRequired(p_00,iVar9,(float)ReqTime);
        iVar2 = Gia_ObjFaninId0p(p,pGVar6);
        Gia_ManDfsUpdateRequired(p_01,iVar2,ReqTime);
      }
      iVar9 = iVar9 + 1;
    }
  }
  iVar9 = vObjs->nSize;
  while( true ) {
    while( true ) {
      if (iVar9 < 1) {
        return p_01;
      }
      iVar9 = iVar9 + -1;
      uVar3 = Vec_IntEntry(vObjs,iVar9);
      if (-1 < (int)uVar3) break;
      uVar3 = ~uVar3;
      iVar4 = Tim_ManBoxOutputFirst(p_00,uVar3);
      iVar1 = Tim_ManBoxOutputNum(p_00,uVar3);
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
        pGVar6 = Gia_ManCi(p,iVar4);
        iVar2 = Gia_ObjId(p,pGVar6);
        iVar5 = Vec_IntEntry(p_01,iVar2);
        iVar2 = ReqTime;
        if (iVar5 != -1) {
          iVar2 = iVar5;
        }
        if (iVar2 < 0) {
          __assert_fail("Req >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x440,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
        }
        iVar5 = Gia_ObjCioId(pGVar6);
        Tim_ManSetCiRequired(p_00,iVar5,(float)iVar2);
        iVar4 = iVar4 + 1;
      }
      iVar4 = Tim_ManBoxInputFirst(p_00,uVar3);
      iVar1 = Tim_ManBoxInputNum(p_00,uVar3);
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
        pGVar6 = Gia_ManCo(p,iVar4);
        iVar2 = Gia_ObjCioId(pGVar6);
        fVar11 = Tim_ManGetCoRequired(p_00,iVar2);
        if ((int)fVar11 < 0) {
          __assert_fail("Req >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x44a,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
        }
        iVar2 = Gia_ObjFaninId0p(p,pGVar6);
        Gia_ManDfsUpdateRequired(p_01,iVar2,(int)fVar11);
        iVar4 = iVar4 + 1;
      }
    }
    if (uVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                    ,0x45f,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
    }
    iVar4 = Vec_IntEntry(p_01,uVar3);
    if (iVar4 < 10) break;
    iVar4 = iVar4 + -10;
    if (p->vMapping == (Vec_Int_t *)0x0) {
      pGVar6 = Gia_ManObj(p,uVar3);
      Gia_ManDfsUpdateRequired(p_01,uVar3 - (*(uint *)pGVar6 & 0x1fffffff),iVar4);
      Gia_ManDfsUpdateRequired(p_01,uVar3 - (*(uint *)&pGVar6->field_0x4 & 0x1fffffff),iVar4);
    }
    else {
      iVar1 = Gia_ObjIsLut(p,uVar3);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsLut(p, Entry)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                      ,0x454,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
      }
      for (lVar8 = 0; iVar1 = Gia_ObjLutSize(p,uVar3), lVar8 < iVar1; lVar8 = lVar8 + 1) {
        piVar7 = Gia_ObjLutFanins(p,uVar3);
        Gia_ManDfsUpdateRequired(p_01,piVar7[lVar8],iVar4);
      }
    }
  }
  __assert_fail("Req >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                ,0x451,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Gia_ManDfsRequireds( Gia_Man_t * p, Vec_Int_t * vObjs, int ReqTime )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vTimes = Vec_IntStartFull( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; 
    int j, Entry, k, iFan, Req;
    Vec_IntWriteEntry( vTimes, 0, 0 );
    if ( pManTime ) 
    {
        int nCoLimit = Gia_ManCoNum(p) - Tim_ManPoNum(pManTime);
        Tim_ManIncrementTravId( pManTime );
        //Tim_ManInitPoRequiredAll( pManTime, (float)ReqTime );
        Gia_ManForEachCo( p, pObj, j )
            if ( j >= nCoLimit )
            {
                Tim_ManSetCoRequired( pManTime, j, ReqTime );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), ReqTime );
            }
    }
    else
    {
        Gia_ManForEachCo( p, pObj, j )
            Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), ReqTime );
    }
    Vec_IntForEachEntryReverse( vObjs, Entry, j )
    {
        if ( Entry < 0 ) // box
        {
            int iFirst, nTerms, iBox = -Entry-1;
            assert( iBox >= 0 );
            // set requireds for box outputs
            iFirst = Tim_ManBoxOutputFirst( pManTime, iBox );
            nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
            for ( k = 0; k < nTerms; k++ )
            {
                pObj = Gia_ManCi( p, iFirst + k );
                Req  = Vec_IntEntry( vTimes, Gia_ObjId(p, pObj) );
                Req  = Req == -1 ? ReqTime : Req; // dangling box output
                assert( Req >= 0 );
                Tim_ManSetCiRequired( pManTime, Gia_ObjCioId(pObj), Req );
            }
            // derive requireds for box inputs
            iFirst = Tim_ManBoxInputFirst( pManTime, iBox );
            nTerms = Tim_ManBoxInputNum( pManTime, iBox );
            for ( k = 0; k < nTerms; k++ )
            {
                pObj = Gia_ManCo( p, iFirst + k );
                Req  = Tim_ManGetCoRequired( pManTime, Gia_ObjCioId(pObj) );
                assert( Req >= 0 );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), Req );
            }
        }
        else if ( Entry > 0 ) // node
        {
            Req = Vec_IntEntry(vTimes, Entry) - 10;
            assert( Req >= 0 );
            if ( Gia_ManHasMapping(p) )
            {
                assert( Gia_ObjIsLut(p, Entry) );
                Gia_LutForEachFanin( p, Entry, iFan, k )
                    Gia_ManDfsUpdateRequired( vTimes, iFan, Req );
            }
            else
            {
                pObj  = Gia_ManObj( p, Entry );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0(pObj, Entry), Req );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId1(pObj, Entry), Req );
            }
        }
        else assert( 0 );
    }
    return vTimes;
}